

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

int __thiscall gl4cts::GPUShaderFP64Test3::programInfo::init(programInfo *this,EVP_PKEY_CTX *ctx)

{
  GLuint GVar1;
  deUint32 dVar2;
  uint err;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  vector<int,_std::allocator<int>_> *pvVar6;
  TestError *pTVar7;
  GLchar *in_RCX;
  long *in_RDX;
  char *__to;
  programInfo *this_00;
  GLchar *in_R8;
  GLchar *in_R9;
  long lVar8;
  GLchar *in_stack_00000008;
  GLchar *in_stack_00000010;
  GLint offset;
  GLuint index;
  GLint matrix_stride;
  vector<int,_std::allocator<int>_> *local_218;
  GLchar *local_210;
  GLchar *uniform_name;
  vector<int,_std::allocator<int>_> *local_200;
  string uniform_name_str;
  string local_1d8 [32];
  stringstream uniform_name_stream;
  ostream local_1a8;
  
  local_218 = (vector<int,_std::allocator<int>_> *)in_R8;
  local_210 = in_R9;
  lVar4 = (**(code **)(**(long **)(ctx + 8) + 0x18))();
  if (init(deqp::Context&,std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>>,char_const*,char_const*,char_const*,char_const*,char_const*)
      ::varying_names == '\0') {
    iVar3 = __cxa_guard_acquire(&init(deqp::Context&,std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>>,char_const*,char_const*,char_const*,char_const*,char_const*)
                                 ::varying_names);
    if (iVar3 != 0) {
      init::varying_names[0] = m_varying_name_gs_fs_gs_result;
      init::varying_names[1] = m_varying_name_gs_fs_tcs_result;
      init::varying_names[2] = m_varying_name_gs_fs_tes_result;
      init::varying_names[3] = m_varying_name_gs_fs_vs_result;
      __cxa_guard_release(&init(deqp::Context&,std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>>,char_const*,char_const*,char_const*,char_const*,char_const*)
                           ::varying_names);
    }
  }
  GVar1 = (**(code **)(lVar4 + 0x3f0))(0x8b30);
  this->m_fragment_shader_id = GVar1;
  GVar1 = (**(code **)(lVar4 + 0x3f0))(0x8dd9);
  this->m_geometry_shader_id = GVar1;
  GVar1 = (**(code **)(lVar4 + 0x3f0))(0x8e88);
  this->m_tesselation_control_shader_id = GVar1;
  GVar1 = (**(code **)(lVar4 + 0x3f0))(0x8e87);
  this->m_tesselation_evaluation_shader_id = GVar1;
  GVar1 = (**(code **)(lVar4 + 0x3f0))(0x8b31);
  this->m_vertex_shader_id = GVar1;
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"CreateShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1326);
  GVar1 = (**(code **)(lVar4 + 0x3c8))();
  this->m_program_object_id = GVar1;
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"CreateProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x132a);
  (**(code **)(lVar4 + 0x14c8))(this->m_program_object_id,4,init::varying_names,0x8c8c);
  err = (**(code **)(lVar4 + 0x800))();
  this_00 = (programInfo *)(ulong)err;
  glu::checkError(err,"TransformFeedbackVaryings",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x132e);
  compile(this_00,(Context *)ctx,this->m_fragment_shader_id,in_RCX);
  compile(this_00,(Context *)ctx,this->m_geometry_shader_id,(GLchar *)local_218);
  compile(this_00,(Context *)ctx,this->m_tesselation_control_shader_id,local_210);
  compile(this_00,(Context *)ctx,this->m_tesselation_evaluation_shader_id,in_stack_00000008);
  compile(this_00,(Context *)ctx,this->m_vertex_shader_id,in_stack_00000010);
  link(this,(char *)ctx,__to);
  GVar1 = (**(code **)(lVar4 + 0xb38))(this->m_program_object_id,m_uniform_block_name);
  this->m_uniform_block_index = GVar1;
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GetUniformBlockIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x133d);
  if (this->m_uniform_block_index == 0xffffffff) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Unifom block is inactive",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x1341);
  }
  else {
    (**(code **)(lVar4 + 0x760))
              (this->m_program_object_id,this->m_uniform_block_index,0x8a40,&this->m_buffer_size);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"GetActiveUniformBlockiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1346);
    if (this->m_buffer_size != 0) {
      lVar8 = *in_RDX;
      local_210 = (GLchar *)in_RDX[1];
      local_218 = &this->m_uniform_offsets;
      pvVar6 = &this->m_uniform_matrix_strides;
      local_200 = pvVar6;
      while( true ) {
        if ((GLchar *)lVar8 == local_210) {
          return (int)pvVar6;
        }
        uniform_name = (GLchar *)0x0;
        uniform_name_str._M_dataplus._M_p = (pointer)&uniform_name_str.field_2;
        uniform_name_str._M_string_length = 0;
        uniform_name_str.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringstream::stringstream((stringstream *)&uniform_name_stream);
        index = 0;
        offset = 0;
        matrix_stride = 0;
        poVar5 = std::operator<<(&local_1a8,m_uniform_block_name);
        poVar5 = std::operator<<(poVar5,".");
        std::operator<<(poVar5,*(char **)(lVar8 + 8));
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&uniform_name_str,local_1d8);
        std::__cxx11::string::~string(local_1d8);
        uniform_name = uniform_name_str._M_dataplus._M_p;
        (**(code **)(lVar4 + 0xb40))(this->m_program_object_id,1,&uniform_name,&index);
        dVar2 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar2,"GetUniformIndices",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x1360);
        if (index == 0xffffffff) break;
        (**(code **)(lVar4 + 0x770))(this->m_program_object_id,1,&index,0x8a3b,&offset);
        dVar2 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar2,"GetActiveUniformsiv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x1369);
        if (offset == -1) {
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,"Unifom has invalid offset",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                     ,0x136d);
          goto LAB_009e1a7c;
        }
        std::vector<int,_std::allocator<int>_>::push_back(local_218,&offset);
        (**(code **)(lVar4 + 0x770))(this->m_program_object_id,1,&index,0x8a3d,&matrix_stride);
        dVar2 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar2,"GetActiveUniformsiv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x1374);
        if (offset == -1) {
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,"Unifom has invalid matrix stride",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                     ,0x1378);
          goto LAB_009e1a7c;
        }
        std::vector<int,_std::allocator<int>_>::push_back(local_200,&matrix_stride);
        std::__cxx11::stringstream::~stringstream((stringstream *)&uniform_name_stream);
        pvVar6 = (vector<int,_std::allocator<int>_> *)
                 std::__cxx11::string::~string((string *)&uniform_name_str);
        lVar8 = lVar8 + 0x20;
      }
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Unifom is inactive",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x1364);
LAB_009e1a7c:
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Unifom block size is 0",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x134a);
  }
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GPUShaderFP64Test3::programInfo::init(deqp::Context& context, const std::vector<uniformDetails> uniform_details,
										   const glw::GLchar* fragment_shader_code,
										   const glw::GLchar* geometry_shader_code,
										   const glw::GLchar* tesselation_control_shader_code,
										   const glw::GLchar* tesselation_evaluation_shader_code,
										   const glw::GLchar* vertex_shader_code)
{
	/* GL entry points */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* Names of varyings to be captured with transform feedback */
	static const glw::GLchar* varying_names[] = { m_varying_name_gs_fs_gs_result, m_varying_name_gs_fs_tcs_result,
												  m_varying_name_gs_fs_tes_result, m_varying_name_gs_fs_vs_result };
	static const glw::GLuint n_varying_names = sizeof(varying_names) / sizeof(varying_names[0]);

	/* Create shader objects */
	m_fragment_shader_id			   = gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_id			   = gl.createShader(GL_GEOMETRY_SHADER);
	m_tesselation_control_shader_id	= gl.createShader(GL_TESS_CONTROL_SHADER);
	m_tesselation_evaluation_shader_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
	m_vertex_shader_id				   = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

	/* Create program object */
	m_program_object_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateProgram");

	/* Set up names of varyings to be captured with transform feedback */
	gl.transformFeedbackVaryings(m_program_object_id, n_varying_names, varying_names, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TransformFeedbackVaryings");

	/* Compile shaders */
	compile(context, m_fragment_shader_id, fragment_shader_code);
	compile(context, m_geometry_shader_id, geometry_shader_code);
	compile(context, m_tesselation_control_shader_id, tesselation_control_shader_code);
	compile(context, m_tesselation_evaluation_shader_id, tesselation_evaluation_shader_code);
	compile(context, m_vertex_shader_id, vertex_shader_code);

	/* Link program */
	link(context);

	/* Inspect program object */
	/* Get index of named uniform block */
	m_uniform_block_index = gl.getUniformBlockIndex(m_program_object_id, m_uniform_block_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformBlockIndex");

	if (GL_INVALID_INDEX == m_uniform_block_index)
	{
		TCU_FAIL("Unifom block is inactive");
	}

	/* Get size of named uniform block */
	gl.getActiveUniformBlockiv(m_program_object_id, m_uniform_block_index, GL_UNIFORM_BLOCK_DATA_SIZE, &m_buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformBlockiv");

	if (0 == m_buffer_size)
	{
		TCU_FAIL("Unifom block size is 0");
	}

	/* Get information about "double precision" uniforms */
	for (std::vector<uniformDetails>::const_iterator it = uniform_details.begin(), end = uniform_details.end();
		 end != it; ++it)
	{
		const glw::GLchar* uniform_name = 0;
		std::string		   uniform_name_str;
		std::stringstream  uniform_name_stream;
		glw::GLuint		   index		 = 0;
		glw::GLint		   offset		 = 0;
		glw::GLint		   matrix_stride = 0;

		/* Uniform name = UNIFORM_BLOCK_NAME.UNIFORM_NAME */
		uniform_name_stream << m_uniform_block_name << "." << it->m_name;

		uniform_name_str = uniform_name_stream.str();
		uniform_name	 = uniform_name_str.c_str();

		/* Get index of uniform */
		gl.getUniformIndices(m_program_object_id, 1 /* count */, &uniform_name, &index);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformIndices");

		if (GL_INVALID_INDEX == index)
		{
			TCU_FAIL("Unifom is inactive");
		}

		/* Get offset of uniform */
		gl.getActiveUniformsiv(m_program_object_id, 1 /* count */, &index, GL_UNIFORM_OFFSET, &offset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformsiv");

		if (m_invalid_uniform_offset == offset)
		{
			TCU_FAIL("Unifom has invalid offset");
		}

		m_uniform_offsets.push_back(offset);

		/* Get matrix stride of uniform */
		gl.getActiveUniformsiv(m_program_object_id, 1 /* count */, &index, GL_UNIFORM_MATRIX_STRIDE, &matrix_stride);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformsiv");

		if (m_invalid_uniform_matrix_stride == offset)
		{
			TCU_FAIL("Unifom has invalid matrix stride");
		}

		m_uniform_matrix_strides.push_back(matrix_stride);
	}
}